

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_int,unsigned_long>
          (BaseAppender *this,Vector *col,uint input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  unsigned_long result;
  uint64_t local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_int,unsigned_long>(input,&local_40,false);
  if (bVar1) {
    *(uint64_t *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_int,unsigned_long>(&local_38,(duckdb *)(ulong)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}